

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_handle_new_session_ticket(ptls_t *tls,ptls_iovec_t message)

{
  code *pcVar1;
  undefined8 uVar2;
  size_t sVar3;
  uint8_t *puVar4;
  ptls_iovec_t pVar5;
  uint8_t *local_2d0;
  size_t local_2c8;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  undefined1 local_288;
  undefined1 local_287;
  undefined1 local_286;
  undefined1 local_285;
  undefined1 local_284;
  undefined1 local_283;
  uint16_t _v_1;
  uint64_t local_280;
  uint64_t _v;
  uint8_t ticket_buf_small [512];
  ptls_buffer_t ticket_buf;
  ptls_iovec_t ticket;
  uint32_t max_early_data_size;
  uint32_t ticket_age_add;
  uint32_t ticket_lifetime;
  int ret;
  uint8_t *end;
  uint8_t *src;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  message_local.base = (uint8_t *)message.len;
  tls_local = (ptls_t *)message.base;
  end = (uint8_t *)((long)&tls_local->ctx + 4);
  _ticket_lifetime = message_local.base + (long)(&tls_local->traffic_protection + -1) + 0x38;
  src = (uint8_t *)tls;
  ticket_age_add =
       decode_new_session_ticket
                 (&max_early_data_size,(uint32_t *)((long)&ticket.len + 4),
                  (ptls_iovec_t *)&ticket_buf.is_allocated,(uint32_t *)&ticket.len,end,
                  _ticket_lifetime);
  message_local.len._4_4_ = ticket_age_add;
  if (ticket_age_add == 0) {
    if (*(long *)(*(long *)src + 0x48) == 0) {
      message_local.len._4_4_ = 0;
    }
    else {
      ptls_buffer_init((ptls_buffer_t *)(ticket_buf_small + 0x1f8),&_v,0x200);
      local_280 = gettime_millis();
      local_288 = (undefined1)(local_280 >> 0x38);
      local_287 = (undefined1)(local_280 >> 0x30);
      local_286 = (undefined1)(local_280 >> 0x28);
      local_285 = (undefined1)(local_280 >> 0x20);
      local_284 = (undefined1)(local_280 >> 0x18);
      local_283 = (undefined1)(local_280 >> 0x10);
      _v_1._0_1_ = (undefined1)(local_280 >> 8);
      _v_1._1_1_ = (undefined1)local_280;
      ticket_age_add =
           ptls_buffer__do_pushv((ptls_buffer_t *)(ticket_buf_small + 0x1f8),&local_288,8);
      if (ticket_age_add == 0) {
        capacity._6_2_ = **(undefined2 **)(src + 0xf0);
        capacity._4_1_ = (undefined1)((ushort)capacity._6_2_ >> 8);
        capacity._5_1_ = (undefined1)capacity._6_2_;
        ticket_age_add =
             ptls_buffer__do_pushv
                       ((ptls_buffer_t *)(ticket_buf_small + 0x1f8),(void *)((long)&capacity + 4),2)
        ;
        if (ticket_age_add == 0) {
          body_start = 3;
          ticket_age_add = ptls_buffer__do_pushv((ptls_buffer_t *)(ticket_buf_small + 0x1f8),"",3);
          sVar3 = ticket_buf.capacity;
          if ((ticket_age_add == 0) &&
             (ticket_age_add =
                   ptls_buffer__do_pushv
                             ((ptls_buffer_t *)(ticket_buf_small + 0x1f8),end,
                              (long)_ticket_lifetime - (long)end), ticket_age_add == 0)) {
            for (; body_start != 0; body_start = body_start - 1) {
              *(char *)(ticket_buf_small._504_8_ + (sVar3 - body_start)) =
                   (char)(ticket_buf.capacity - sVar3 >> (((char)body_start + -1) * '\b' & 0x3fU));
            }
            body_start_1 = 2;
            ticket_age_add = ptls_buffer__do_pushv((ptls_buffer_t *)(ticket_buf_small + 0x1f8),"",2)
            ;
            sVar3 = ticket_buf.capacity;
            if (((ticket_age_add == 0) &&
                (ticket_age_add =
                      ptls_buffer_reserve((ptls_buffer_t *)(ticket_buf_small + 0x1f8),
                                          *(size_t *)(**(long **)(src + 0x50) + 8)),
                ticket_age_add == 0)) &&
               (ticket_age_add =
                     derive_resumption_secret
                               (*(st_ptls_key_schedule_t **)(src + 0x50),
                                (uint8_t *)(ticket_buf_small._504_8_ + ticket_buf.capacity)),
               puVar4 = src, ticket_age_add == 0)) {
              ticket_buf.capacity = *(long *)(**(long **)(src + 0x50) + 8) + ticket_buf.capacity;
              for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
                *(char *)(ticket_buf_small._504_8_ + (sVar3 - body_start_1)) =
                     (char)(ticket_buf.capacity - sVar3 >>
                           (((char)body_start_1 + -1) * '\b' & 0x3fU));
              }
              pcVar1 = (code *)**(undefined8 **)(*(long *)src + 0x48);
              uVar2 = *(undefined8 *)(*(long *)src + 0x48);
              pVar5 = ptls_iovec_init((void *)ticket_buf_small._504_8_,ticket_buf.capacity);
              local_2d0 = pVar5.base;
              local_2c8 = pVar5.len;
              ticket_age_add = (*pcVar1)(uVar2,puVar4,local_2d0,local_2c8);
              if (ticket_age_add == 0) {
                ticket_age_add = 0;
              }
            }
          }
        }
      }
      ptls_buffer_dispose((ptls_buffer_t *)(ticket_buf_small + 0x1f8));
      message_local.len._4_4_ = ticket_age_add;
    }
  }
  return message_local.len._4_4_;
}

Assistant:

static int client_handle_new_session_ticket(ptls_t *tls, ptls_iovec_t message)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *end = message.base + message.len;
    int ret;

    { /* verify the format */
        uint32_t ticket_lifetime, ticket_age_add, max_early_data_size;
        ptls_iovec_t ticket;
        if ((ret = decode_new_session_ticket(&ticket_lifetime, &ticket_age_add, &ticket, &max_early_data_size, src, end)) != 0)
            return ret;
    }

    /* do nothing if use of session ticket is disabled */
    if (tls->ctx->save_ticket == NULL)
        return 0;

    /* save the extension, along with the key of myself */
    ptls_buffer_t ticket_buf;
    uint8_t ticket_buf_small[512];
    ptls_buffer_init(&ticket_buf, ticket_buf_small, sizeof(ticket_buf_small));
    ptls_buffer_push64(&ticket_buf, gettime_millis());
    ptls_buffer_push16(&ticket_buf, tls->cipher_suite->id);
    ptls_buffer_push_block(&ticket_buf, 3, { ptls_buffer_pushv(&ticket_buf, src, end - src); });
    ptls_buffer_push_block(&ticket_buf, 2, {
        if ((ret = ptls_buffer_reserve(&ticket_buf, tls->key_schedule->algo->digest_size)) != 0)
            goto Exit;
        if ((ret = derive_resumption_secret(tls->key_schedule, ticket_buf.base + ticket_buf.off)) != 0)
            goto Exit;
        ticket_buf.off += tls->key_schedule->algo->digest_size;
    });

    if ((ret = tls->ctx->save_ticket->cb(tls->ctx->save_ticket, tls, ptls_iovec_init(ticket_buf.base, ticket_buf.off))) != 0)
        goto Exit;

    ret = 0;
Exit:
    ptls_buffer_dispose(&ticket_buf);
    return ret;
}